

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O3

void __thiscall cmCTestLaunch::RunChild(cmCTestLaunch *this)

{
  pointer pbVar1;
  int64_t iVar2;
  undefined4 uVar3;
  undefined3 uVar4;
  _func_int **pp_Var5;
  undefined8 uVar6;
  cmUVStreamReadHandle *pcVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  cmUVProcessChainBuilder *pcVar12;
  uv_loop_t *loop;
  Status *pSVar13;
  bool errFinished;
  bool outFinished;
  undefined1 local_500 [8];
  cmUVStreamReadHandle *local_4f8;
  cmUVStreamReadHandle *local_4f0;
  cmProcessOutput processOutput;
  cmUVProcessChain chain;
  uv_pipe_ptr errPipe;
  uv_pipe_ptr outPipe;
  anon_class_16_2_57ddfa98 beginRead;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a0;
  cmUVProcessChainBuilder builder;
  ofstream ferr;
  ofstream fout;
  
  pbVar1 = (this->RealArgs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((pbVar1 != (this->RealArgs).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) &&
     (iVar9 = std::__cxx11::string::compare((char *)pbVar1), iVar9 != 0)) {
    cmUVProcessChainBuilder::cmUVProcessChainBuilder(&builder);
    cmUVProcessChainBuilder::AddCommand(&builder,&this->RealArgV);
    std::ofstream::ofstream(&fout);
    std::ofstream::ofstream(&ferr);
    if ((this->Reporter).Passthru == true) {
      pcVar12 = cmUVProcessChainBuilder::SetExternalStream(&builder,Stream_OUTPUT,_stdout);
      cmUVProcessChainBuilder::SetExternalStream(pcVar12,Stream_ERROR,_stderr);
    }
    else {
      pcVar12 = cmUVProcessChainBuilder::SetBuiltinStream(&builder,Stream_OUTPUT);
      cmUVProcessChainBuilder::SetBuiltinStream(pcVar12,Stream_ERROR);
      std::ofstream::open((char *)&fout,(_Ios_Openmode)(this->Reporter).LogOut._M_dataplus._M_p);
      std::ofstream::open((char *)&ferr,(_Ios_Openmode)(this->Reporter).LogErr._M_dataplus._M_p);
    }
    cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)&chain);
    outPipe.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle.
    super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    outPipe.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle.
    super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    errPipe.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle.
    super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    errPipe.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle.
    super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    outFinished = true;
    errFinished = true;
    cmProcessOutput::cmProcessOutput(&processOutput,Auto,0x400);
    local_4f0 = (cmUVStreamReadHandle *)0x0;
    local_4f8 = (cmUVStreamReadHandle *)0x0;
    if ((this->Reporter).Passthru != true) {
      beginRead.chain = &chain;
      beginRead.processOutput = &processOutput;
      uVar10 = cmUVProcessChain::OutputStream(&chain);
      RunChild::anon_class_16_2_57ddfa98::operator()
                ((anon_class_16_2_57ddfa98 *)local_500,(uv_pipe_ptr *)&beginRead,(int)&outPipe,
                 (ostream *)(ulong)uVar10,(ofstream *)&std::cout,(bool *)&fout,&this->HaveOut,
                 (int)&outFinished);
      pcVar7 = local_4f0;
      local_4f0 = (cmUVStreamReadHandle *)local_500;
      local_500 = (undefined1  [8])0x0;
      if ((pcVar7 != (cmUVStreamReadHandle *)0x0) &&
         (std::default_delete<cmUVStreamReadHandle>::operator()
                    ((default_delete<cmUVStreamReadHandle> *)&local_4f0,pcVar7),
         local_500 != (undefined1  [8])0x0)) {
        std::default_delete<cmUVStreamReadHandle>::operator()
                  ((default_delete<cmUVStreamReadHandle> *)local_500,
                   (cmUVStreamReadHandle *)local_500);
      }
      uVar10 = cmUVProcessChain::ErrorStream(&chain);
      RunChild::anon_class_16_2_57ddfa98::operator()
                ((anon_class_16_2_57ddfa98 *)local_500,(uv_pipe_ptr *)&beginRead,(int)&errPipe,
                 (ostream *)(ulong)uVar10,(ofstream *)&std::cerr,(bool *)&ferr,&this->HaveErr,
                 (int)&errFinished);
      pcVar7 = local_4f8;
      local_4f8 = (cmUVStreamReadHandle *)local_500;
      local_500 = (undefined1  [8])0x0;
      if ((pcVar7 != (cmUVStreamReadHandle *)0x0) &&
         (std::default_delete<cmUVStreamReadHandle>::operator()
                    ((default_delete<cmUVStreamReadHandle> *)&local_4f8,pcVar7),
         local_500 != (undefined1  [8])0x0)) {
        std::default_delete<cmUVStreamReadHandle>::operator()
                  ((default_delete<cmUVStreamReadHandle> *)local_500,
                   (cmUVStreamReadHandle *)local_500);
      }
    }
    while (((bVar8 = cmUVProcessChain::Finished(&chain), !bVar8 || (outFinished != true)) ||
           ((errFinished & 1U) == 0))) {
      loop = cmUVProcessChain::GetLoop(&chain);
      uv_run(loop,UV_RUN_ONCE);
    }
    pSVar13 = cmUVProcessChain::GetStatus(&chain,0);
    uVar3 = *(undefined4 *)&pSVar13->field_0x14;
    (this->Reporter).Status.TermSignal = pSVar13->TermSignal;
    *(undefined4 *)&(this->Reporter).Status.field_0x14 = uVar3;
    bVar8 = pSVar13->Finished;
    uVar4 = *(undefined3 *)&pSVar13->field_0x5;
    iVar2 = pSVar13->ExitStatus;
    (this->Reporter).Status.SpawnResult = pSVar13->SpawnResult;
    (this->Reporter).Status.Finished = bVar8;
    *(undefined3 *)&(this->Reporter).Status.field_0x5 = uVar4;
    (this->Reporter).Status.ExitStatus = iVar2;
    cmUVProcessChain::Status::GetException_abi_cxx11_
              ((pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&beginRead,&(this->Reporter).Status);
    iVar9 = (int)beginRead.chain;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)beginRead.processOutput != &local_4a0) {
      operator_delete(beginRead.processOutput,local_4a0._M_allocated_capacity + 1);
    }
    iVar11 = 1;
    if (iVar9 != 5) {
      iVar11 = (int)(this->Reporter).Status.ExitStatus;
    }
    (this->Reporter).ExitCode = iVar11;
    if (local_4f8 != (cmUVStreamReadHandle *)0x0) {
      std::default_delete<cmUVStreamReadHandle>::operator()
                ((default_delete<cmUVStreamReadHandle> *)&local_4f8,local_4f8);
    }
    if (local_4f0 != (cmUVStreamReadHandle *)0x0) {
      std::default_delete<cmUVStreamReadHandle>::operator()
                ((default_delete<cmUVStreamReadHandle> *)&local_4f0,local_4f0);
    }
    ::cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_
              ((uv_handle_ptr_base_<uv_pipe_s> *)&errPipe);
    ::cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_
              ((uv_handle_ptr_base_<uv_pipe_s> *)&outPipe);
    cmUVProcessChain::~cmUVProcessChain(&chain);
    uVar6 = _EVP_PKEY_get_bn_param;
    pp_Var5 = _VTT;
    ferr.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream = _VTT;
    *(undefined8 *)(_VTT[-3] + (long)&ferr.super_basic_ostream<char,_std::char_traits<char>_>) =
         _EVP_PKEY_get_bn_param;
    std::filebuf::~filebuf
              ((filebuf *)&ferr.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
    std::ios_base::~ios_base
              ((ios_base *)&ferr.super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
    fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream = pp_Var5;
    *(undefined8 *)(pp_Var5[-3] + (long)&fout.super_basic_ostream<char,_std::char_traits<char>_>) =
         uVar6;
    std::filebuf::~filebuf
              ((filebuf *)&fout.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
    std::ios_base::~ios_base
              ((ios_base *)&fout.super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)builder.WorkingDirectory._M_dataplus._M_p != &builder.WorkingDirectory.field_2) {
      operator_delete(builder.WorkingDirectory._M_dataplus._M_p,
                      builder.WorkingDirectory.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
    ::~vector(&builder.Processes);
    return;
  }
  (this->Reporter).ExitCode = 0;
  return;
}

Assistant:

void cmCTestLaunch::RunChild()
{
  // Ignore noopt make rules
  if (this->RealArgs.empty() || this->RealArgs[0] == ":") {
    this->Reporter.ExitCode = 0;
    return;
  }

  // Prepare to run the real command.
  cmUVProcessChainBuilder builder;
  builder.AddCommand(this->RealArgV);

  cmsys::ofstream fout;
  cmsys::ofstream ferr;
  if (this->Reporter.Passthru) {
    // In passthru mode we just share the output pipes.
    builder.SetExternalStream(cmUVProcessChainBuilder::Stream_OUTPUT, stdout)
      .SetExternalStream(cmUVProcessChainBuilder::Stream_ERROR, stderr);
  } else {
    // In full mode we record the child output pipes to log files.
    builder.SetBuiltinStream(cmUVProcessChainBuilder::Stream_OUTPUT)
      .SetBuiltinStream(cmUVProcessChainBuilder::Stream_ERROR);
    fout.open(this->Reporter.LogOut.c_str(), std::ios::out | std::ios::binary);
    ferr.open(this->Reporter.LogErr.c_str(), std::ios::out | std::ios::binary);
  }

#ifdef _WIN32
  // Do this so that newline transformation is not done when writing to cout
  // and cerr below.
  _setmode(fileno(stdout), _O_BINARY);
  _setmode(fileno(stderr), _O_BINARY);
#endif

  // Run the real command.
  auto chain = builder.Start();

  // Record child stdout and stderr if necessary.
  cm::uv_pipe_ptr outPipe;
  cm::uv_pipe_ptr errPipe;
  bool outFinished = true;
  bool errFinished = true;
  cmProcessOutput processOutput;
  std::unique_ptr<cmUVStreamReadHandle> outputHandle;
  std::unique_ptr<cmUVStreamReadHandle> errorHandle;
  if (!this->Reporter.Passthru) {
    auto beginRead = [&chain, &processOutput](
                       cm::uv_pipe_ptr& pipe, int stream, std::ostream& out,
                       cmsys::ofstream& file, bool& haveData, bool& finished,
                       int id) -> std::unique_ptr<cmUVStreamReadHandle> {
      pipe.init(chain.GetLoop(), 0);
      uv_pipe_open(pipe, stream);
      finished = false;
      return cmUVStreamRead(
        pipe,
        [&processOutput, &out, &file, id, &haveData](std::vector<char> data) {
          std::string strdata;
          processOutput.DecodeText(data.data(), data.size(), strdata, id);
          file.write(strdata.c_str(), strdata.size());
          out.write(strdata.c_str(), strdata.size());
          haveData = true;
        },
        [&processOutput, &out, &file, &finished, id]() {
          std::string strdata;
          processOutput.DecodeText(std::string(), strdata, id);
          if (!strdata.empty()) {
            file.write(strdata.c_str(), strdata.size());
            out.write(strdata.c_str(), strdata.size());
          }
          finished = true;
        });
    };
    outputHandle = beginRead(outPipe, chain.OutputStream(), std::cout, fout,
                             this->HaveOut, outFinished, 1);
    errorHandle = beginRead(errPipe, chain.ErrorStream(), std::cerr, ferr,
                            this->HaveErr, errFinished, 2);
  }

  // Wait for the real command to finish.
  while (!(chain.Finished() && outFinished && errFinished)) {
    uv_run(&chain.GetLoop(), UV_RUN_ONCE);
  }
  this->Reporter.Status = chain.GetStatus(0);
  if (this->Reporter.Status.GetException().first ==
      cmUVProcessChain::ExceptionCode::Spawn) {
    this->Reporter.ExitCode = 1;
  } else {
    this->Reporter.ExitCode =
      static_cast<int>(this->Reporter.Status.ExitStatus);
  }
}